

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

int bip32_key_from_base58_n(char *base58,size_t base58_len,ext_key *output)

{
  size_t local_90;
  size_t written;
  uchar bytes [82];
  int local_2c;
  int ret;
  ext_key *output_local;
  size_t base58_len_local;
  char *base58_local;
  
  base58_local._4_4_ = wally_base58_n_to_bytes(base58,base58_len,1,(uchar *)&written,0x52,&local_90)
  ;
  if (base58_local._4_4_ == 0) {
    if (local_90 == 0x4e) {
      local_2c = bip32_key_unserialize((uchar *)&written,0x4e,output);
    }
    else {
      local_2c = -2;
    }
    wally_clear(&written,0x52);
    base58_local._4_4_ = local_2c;
  }
  return base58_local._4_4_;
}

Assistant:

int bip32_key_from_base58_n(const char *base58, size_t base58_len,
                            struct ext_key *output)
{
    int ret;
    unsigned char bytes[BIP32_SERIALIZED_LEN + BASE58_CHECKSUM_LEN];
    size_t written;

    if ((ret = wally_base58_n_to_bytes(base58, base58_len, BASE58_FLAG_CHECKSUM,
                                       bytes, sizeof(bytes), &written)))
        return ret;

    if (written != BIP32_SERIALIZED_LEN)
        ret = WALLY_EINVAL;
    else
        ret = bip32_key_unserialize(bytes, BIP32_SERIALIZED_LEN, output);

    wally_clear(bytes, sizeof(bytes));
    return ret;
}